

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UpnpDiscovery.c
# Opt level: O0

int UpnpDiscovery_assign(UpnpDiscovery *p,UpnpDiscovery *q)

{
  int iVar1;
  UpnpString *pUVar2;
  sockaddr_storage *buf;
  bool bVar3;
  bool bVar4;
  undefined1 local_b9;
  undefined4 local_1c;
  int ok;
  UpnpDiscovery *q_local;
  UpnpDiscovery *p_local;
  
  local_1c = 1;
  if (p != q) {
    iVar1 = UpnpDiscovery_get_ErrCode(q);
    iVar1 = UpnpDiscovery_set_ErrCode(p,iVar1);
    bVar3 = false;
    if (iVar1 != 0) {
      iVar1 = UpnpDiscovery_get_Expires(q);
      iVar1 = UpnpDiscovery_set_Expires(p,iVar1);
      bVar3 = iVar1 != 0;
    }
    bVar4 = false;
    if (bVar3) {
      pUVar2 = UpnpDiscovery_get_DeviceID(q);
      iVar1 = UpnpDiscovery_set_DeviceID(p,pUVar2);
      bVar4 = iVar1 != 0;
    }
    bVar3 = false;
    if (bVar4) {
      pUVar2 = UpnpDiscovery_get_DeviceType(q);
      iVar1 = UpnpDiscovery_set_DeviceType(p,pUVar2);
      bVar3 = iVar1 != 0;
    }
    bVar4 = false;
    if (bVar3) {
      pUVar2 = UpnpDiscovery_get_ServiceType(q);
      iVar1 = UpnpDiscovery_set_ServiceType(p,pUVar2);
      bVar4 = iVar1 != 0;
    }
    bVar3 = false;
    if (bVar4) {
      pUVar2 = UpnpDiscovery_get_ServiceVer(q);
      iVar1 = UpnpDiscovery_set_ServiceVer(p,pUVar2);
      bVar3 = iVar1 != 0;
    }
    bVar4 = false;
    if (bVar3) {
      pUVar2 = UpnpDiscovery_get_Location(q);
      iVar1 = UpnpDiscovery_set_Location(p,pUVar2);
      bVar4 = iVar1 != 0;
    }
    bVar3 = false;
    if (bVar4) {
      pUVar2 = UpnpDiscovery_get_Os(q);
      iVar1 = UpnpDiscovery_set_Os(p,pUVar2);
      bVar3 = iVar1 != 0;
    }
    bVar4 = false;
    if (bVar3) {
      pUVar2 = UpnpDiscovery_get_Date(q);
      iVar1 = UpnpDiscovery_set_Date(p,pUVar2);
      bVar4 = iVar1 != 0;
    }
    bVar3 = false;
    if (bVar4) {
      pUVar2 = UpnpDiscovery_get_Ext(q);
      iVar1 = UpnpDiscovery_set_Ext(p,pUVar2);
      bVar3 = iVar1 != 0;
    }
    local_b9 = false;
    if (bVar3) {
      buf = UpnpDiscovery_get_DestAddr(q);
      iVar1 = UpnpDiscovery_set_DestAddr(p,buf);
      local_b9 = iVar1 != 0;
    }
    local_1c = (uint)local_b9;
  }
  return local_1c;
}

Assistant:

int UpnpDiscovery_assign(UpnpDiscovery *p, const UpnpDiscovery *q)
{
	int ok = 1;

	if (p != q) {
		ok = ok &&
		     UpnpDiscovery_set_ErrCode(p, UpnpDiscovery_get_ErrCode(q));
		ok = ok &&
		     UpnpDiscovery_set_Expires(p, UpnpDiscovery_get_Expires(q));
		ok = ok && UpnpDiscovery_set_DeviceID(
				   p, UpnpDiscovery_get_DeviceID(q));
		ok = ok && UpnpDiscovery_set_DeviceType(
				   p, UpnpDiscovery_get_DeviceType(q));
		ok = ok && UpnpDiscovery_set_ServiceType(
				   p, UpnpDiscovery_get_ServiceType(q));
		ok = ok && UpnpDiscovery_set_ServiceVer(
				   p, UpnpDiscovery_get_ServiceVer(q));
		ok = ok && UpnpDiscovery_set_Location(
				   p, UpnpDiscovery_get_Location(q));
		ok = ok && UpnpDiscovery_set_Os(p, UpnpDiscovery_get_Os(q));
		ok = ok && UpnpDiscovery_set_Date(p, UpnpDiscovery_get_Date(q));
		ok = ok && UpnpDiscovery_set_Ext(p, UpnpDiscovery_get_Ext(q));
		ok = ok && UpnpDiscovery_set_DestAddr(
				   p, UpnpDiscovery_get_DestAddr(q));
	}

	return ok;
}